

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

JavascriptPromiseAllSettledResolveOrRejectElementFunction * __thiscall
Js::JavascriptLibrary::CreatePromiseAllSettledResolveOrRejectElementFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,uint32 index,JavascriptArray *values,
          JavascriptPromiseCapability *capabilities,
          JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *remainingElements,
          JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyCalledWrapper,
          bool isRejecting)

{
  DynamicType *type;
  Recycler *recycler;
  JavascriptPromiseAllSettledResolveOrRejectElementFunction *this_00;
  undefined1 local_68 [8];
  TrackAllocData data;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_31;
  
  data._32_8_ = capabilities;
  type = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Function,
                          &((this->super_JavascriptLibraryBase).functionPrototype.ptr)->
                           super_RecyclableObject,entryPoint,
                          (DynamicTypeHandler *)
                          DeferredTypeHandler<&(bool_Js::JavascriptLibrary::InitializeFunction<false,false,false,false>(Js::DynamicObject*,Js::DeferredTypeHandlerBase*,Js::DeferredInitializeMode)),Js::InitializeFunctionDeferredTypeHandlerFilter<false,false,false>,false,(unsigned_short)0,(unsigned_short)0>
                          ::defaultInstance,false,false);
  local_68 = (undefined1  [8])&JavascriptPromiseAllSettledResolveOrRejectElementFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x1a11;
  recycler = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_68);
  this_00 = (JavascriptPromiseAllSettledResolveOrRejectElementFunction *)
            new<(Memory::ObjectInfoBits)1>(0x78,recycler,&local_31);
  JavascriptPromiseAllSettledResolveOrRejectElementFunction::
  JavascriptPromiseAllSettledResolveOrRejectElementFunction
            (this_00,type,
             (FunctionInfo *)JavascriptPromise::EntryInfo::AllSettledResolveOrRejectElementFunction,
             index,values,(JavascriptPromiseCapability *)data._32_8_,remainingElements,
             alreadyCalledWrapper,isRejecting);
  (**(code **)((long)(this_00->super_JavascriptPromiseAllResolveElementFunction).
                     super_RuntimeFunction.super_JavascriptFunction.super_DynamicObject.
                     super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject +
              0xf0))(this_00,0xd1,&DAT_1000000000001,2,0,0,0xf);
  return this_00;
}

Assistant:

JavascriptPromiseAllSettledResolveOrRejectElementFunction* JavascriptLibrary::CreatePromiseAllSettledResolveOrRejectElementFunction(JavascriptMethod entryPoint, uint32 index, JavascriptArray* values, JavascriptPromiseCapability* capabilities, JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingElements, JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyCalledWrapper, bool isRejecting)
    {
        FunctionInfo* functionInfo = &Js::JavascriptPromise::EntryInfo::AllSettledResolveOrRejectElementFunction;
        DynamicType* type = DynamicType::New(scriptContext, TypeIds_Function, functionPrototype, entryPoint, GetDeferredAnonymousFunctionTypeHandler());
        JavascriptPromiseAllSettledResolveOrRejectElementFunction* function = RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptPromiseAllSettledResolveOrRejectElementFunction, type, functionInfo, index, values, capabilities, remainingElements, alreadyCalledWrapper, isRejecting);

        function->SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable, nullptr);

        return function;
    }